

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

int doMain(int startArgumentIndex,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  sysbvm_context_t *psVar5;
  bool bVar6;
  int iVar7;
  sysbvm_tuple_t sVar8;
  size_t sVar9;
  sysbvm_tuple_t sVar10;
  sysbvm_tuple_t language;
  bool bVar11;
  char *pcVar12;
  int i;
  size_t sVar13;
  anon_struct_72_9_3b666fec gcFrame;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *psStack_40;
  
  psStack_40 = &local_a8;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_68 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_a8 = sysbvm_orderedCollection_create(context);
  sStack_a0 = sysbvm_orderedCollection_create(context);
  local_88 = sysbvm_orderedCollection_create(context);
  bVar1 = startArgumentIndex < argc;
  if (startArgumentIndex < argc) {
    bVar3 = false;
    bVar4 = false;
    bVar11 = false;
    bVar6 = false;
    do {
      sVar10 = sStack_a0;
      psVar5 = context;
      pcVar12 = argv[startArgumentIndex];
      if (bVar11) {
        sVar8 = sysbvm_string_createWithCString(context,pcVar12);
        sysbvm_orderedCollection_add(psVar5,sVar10,sVar8);
        bVar2 = false;
      }
      else if (*pcVar12 == '-') {
        iVar7 = strcmp(pcVar12,"-help");
        if (iVar7 == 0) {
          pcVar12 = "sysbvm-lispi <inputfile> <inputfile> -- args";
        }
        else {
          iVar7 = strcmp(pcVar12,"-version");
          if (iVar7 != 0) {
            iVar7 = strcmp(pcVar12,"-save-image");
            if (iVar7 != 0) {
              iVar7 = strcmp(pcVar12,"-scan-only");
              bVar2 = false;
              if (iVar7 == 0) {
                bVar3 = true;
                bVar2 = false;
              }
              else {
                iVar7 = strcmp(pcVar12,"-parse-only");
                if (iVar7 == 0) {
                  bVar4 = true;
                  bVar2 = false;
                }
                else {
                  iVar7 = strcmp(pcVar12,"-print-stats");
                  if (iVar7 == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar7 = strcmp(pcVar12,"-e");
                    if (iVar7 == 0) {
                      sStack_90 = sysbvm_string_createWithCString
                                            (context,argv[(long)startArgumentIndex + 1]);
                      sysbvm_orderedCollection_add(context,local_88,sStack_90);
                      startArgumentIndex = startArgumentIndex + 1;
                    }
                    else {
                      iVar7 = strcmp(pcVar12,"--");
                      if (iVar7 == 0) {
                        bVar11 = true;
                      }
                    }
                  }
                }
              }
              goto LAB_00102824;
            }
            destinationImageFilename = argv[(long)startArgumentIndex + 1];
            startArgumentIndex = startArgumentIndex + 1;
            goto LAB_00102804;
          }
          pcVar12 = "sysbvm-lispi version 0.1";
        }
        puts(pcVar12);
        bVar2 = true;
      }
      else {
        local_98 = sysbvm_string_createWithCString(context,pcVar12);
        sysbvm_orderedCollection_add(context,local_a8,local_98);
LAB_00102804:
        bVar2 = false;
      }
LAB_00102824:
      if (bVar2) break;
      startArgumentIndex = startArgumentIndex + 1;
      bVar1 = startArgumentIndex < argc;
    } while (startArgumentIndex < argc);
  }
  else {
    bVar6 = false;
    bVar4 = false;
    bVar3 = false;
  }
  if (!bVar1) {
    if (bVar3 || bVar4) {
      local_68 = sysbvm_orderedCollection_create(context);
      sVar9 = sysbvm_orderedCollection_getSize(local_a8);
      if (sVar9 != 0) {
        sVar13 = 0;
        do {
          local_98 = sysbvm_orderedCollection_at(local_a8,sVar13);
          local_98 = sysbvm_filesystem_absolute(context,local_98);
          sStack_80 = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context,local_98);
          local_78 = sysbvm_scanner_scan(context,sStack_80);
          if (bVar3) {
            sysbvm_orderedCollection_add(context,local_68,local_78);
          }
          if (bVar4) {
            sStack_70 = sysbvm_parser_parseTokens(context,sStack_80,local_78);
            sysbvm_orderedCollection_add(context,local_68,sStack_70);
          }
          sVar13 = sVar13 + 1;
        } while (sVar9 != sVar13);
      }
    }
    else {
      sVar9 = sysbvm_orderedCollection_getSize(local_a8);
      if (sVar9 != 0) {
        sVar13 = 0;
        do {
          local_98 = sysbvm_orderedCollection_at(local_a8,sVar13);
          local_98 = sysbvm_filesystem_absolute(context,local_98);
          sysbvm_interpreter_loadSourceNamedWithSolvedPath(context,local_98);
          sVar13 = sVar13 + 1;
        } while (sVar9 != sVar13);
      }
      psVar5 = context;
      sVar10 = sysbvm_analysisQueue_getDefault(context);
      sysbvm_analysisQueue_waitPendingAnalysis(psVar5,sVar10);
      sVar9 = sysbvm_orderedCollection_getSize(local_88);
      if (sVar9 != 0) {
        sVar13 = 0;
        do {
          sVar10 = sysbvm_orderedCollection_at(local_88,sVar13);
          psVar5 = context;
          local_88 = sVar10;
          sVar8 = sysbvm_string_createWithCString(context,"commandLine");
          language = sysbvm_symbol_internWithCString(context,"sysmel");
          sysbvm_interpreter_evaluateScript(psVar5,sVar10,sVar8,language);
          sVar13 = sVar13 + 1;
        } while (sVar9 != sVar13);
      }
      psVar5 = context;
      sVar10 = sysbvm_analysisQueue_getDefault(context);
      sysbvm_analysisQueue_waitPendingAnalysis(psVar5,sVar10);
    }
    if (bVar6) {
      sysbvm_context_printMemoryUsageStats(context);
    }
    sysbvm_stackFrame_popRecord(&local_58);
  }
  return 0;
}

Assistant:

int doMain(int startArgumentIndex, int argc, const char *argv[])
{
    bool scanOnly = false;
    bool parseOnly = false;
    bool printStats = false;
    struct {
        sysbvm_tuple_t filesToProcess;
        sysbvm_tuple_t remainingArgs;
        sysbvm_tuple_t inputFileName;
        sysbvm_tuple_t inlineScriptToRun;
        sysbvm_tuple_t inlineScriptsToRun;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t scanResult;
        sysbvm_tuple_t parseResult;
        sysbvm_tuple_t parseScanResults;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Parse the command line.
    gcFrame.filesToProcess = sysbvm_orderedCollection_create(context);
    gcFrame.remainingArgs = sysbvm_orderedCollection_create(context);
    gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_create(context);
    bool isParsingRemainingArgs = false;
    for(int i = startArgumentIndex; i < argc; ++i)
    {
        const char *arg = argv[i];
        if(isParsingRemainingArgs)
        {
            sysbvm_orderedCollection_add(context, gcFrame.remainingArgs, sysbvm_string_createWithCString(context, arg));
            continue;
        }
        
        if(*arg == '-')
        {
            if(!strcmp(arg, "-help"))
            {
                printHelp();
                return 0;
            }
            else if(!strcmp(arg, "-version"))
            {
                printVersion();
                return 0;
            }
            else if(!strcmp(arg, "-save-image"))
            {
                arg = argv[++i];
                destinationImageFilename = arg;
            }
            else if(!strcmp(arg, "-scan-only"))
            {
                scanOnly = true;
            }
            else if(!strcmp(arg, "-parse-only"))
            {
                parseOnly = true;
            }
            else if(!strcmp(arg, "-print-stats"))
            {
                printStats = true;
            }
            else if(!strcmp(arg, "-e"))
            {
                arg = argv[++i];
                gcFrame.inlineScriptToRun = sysbvm_string_createWithCString(context, arg);
                sysbvm_orderedCollection_add(context, gcFrame.inlineScriptsToRun, gcFrame.inlineScriptToRun);
            }
            else if(!strcmp(arg, "--"))
            {
                isParsingRemainingArgs = true;
            }
            else if(!strcmp(argv[i], "-m32") ||
                !strcmp(argv[i], "-m64") ||
                !strcmp(argv[i], "-nojit") ||
                !strcmp(argv[i], "-nogc")
            )
            {
                // These options are parsed before the context creation.
            }
        }
        else
        {
            gcFrame.inputFileName = sysbvm_string_createWithCString(context, arg);
            sysbvm_orderedCollection_add(context, gcFrame.filesToProcess, gcFrame.inputFileName);
        }
    }

    if(scanOnly || parseOnly)
    {
        gcFrame.parseScanResults = sysbvm_orderedCollection_create(context);
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                gcFrame.sourceCode = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context, gcFrame.inputFileName);
                gcFrame.scanResult = sysbvm_scanner_scan(context, gcFrame.sourceCode);
                if(scanOnly)
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.scanResult);

                if(parseOnly)
                {
                    gcFrame.parseResult = sysbvm_parser_parseTokens(context, gcFrame.sourceCode, gcFrame.scanResult);
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.parseResult);
                }
            }

        }
    }
    else
    {
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                sysbvm_interpreter_loadSourceNamedWithSolvedPath(context, gcFrame.inputFileName);
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }

        {
            size_t inlineScriptToRunCount = sysbvm_orderedCollection_getSize(gcFrame.inlineScriptsToRun);
            for(size_t i = 0; i < inlineScriptToRunCount; ++i)
            {
                gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_at(gcFrame.inlineScriptsToRun, i);
                sysbvm_interpreter_evaluateScript(context, gcFrame.inlineScriptsToRun, sysbvm_string_createWithCString(context, "commandLine"), sysbvm_symbol_internWithCString(context, "sysmel"));
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }
    }

    if(printStats)
        sysbvm_context_printMemoryUsageStats(context);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return 0;
}